

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O1

void generate_a_record(Person *person)

{
  int iVar1;
  string *psVar2;
  Rep *pRVar3;
  bool bVar4;
  Person_PhoneNumber *pPVar5;
  Arena *pAVar6;
  string number;
  string email;
  string name;
  string local_88;
  string local_68;
  string local_48;
  
  *(byte *)(person->_has_bits_).has_bits_ = (byte)(person->_has_bits_).has_bits_[0] | 4;
  person->id_ = 0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"John Doe","");
  *(byte *)(person->_has_bits_).has_bits_ = (byte)(person->_has_bits_).has_bits_[0] | 1;
  pAVar6 = *(Arena **)&person->field_0x8;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  psVar2 = (person->name_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstance(&person->name_,pAVar6,&local_48);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"JohnDoe@gmail.com","");
  *(byte *)(person->_has_bits_).has_bits_ = (byte)(person->_has_bits_).has_bits_[0] | 2;
  pAVar6 = *(Arena **)&person->field_0x8;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  psVar2 = (person->email_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstance(&person->email_,pAVar6,&local_68);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"032-9898-8765","");
  pRVar3 = (person->phones_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0010796f:
    google::protobuf::internal::RepeatedPtrFieldBase::Reserve((int)person + 0x18);
  }
  else {
    iVar1 = (person->phones_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (person->phones_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pPVar5 = (Person_PhoneNumber *)pRVar3->elements[iVar1];
      goto LAB_001079a2;
    }
    if (pRVar3->allocated_size == (person->phones_).super_RepeatedPtrFieldBase.total_size_)
    goto LAB_0010796f;
  }
  pRVar3 = (person->phones_).super_RepeatedPtrFieldBase.rep_;
  pRVar3->allocated_size = pRVar3->allocated_size + 1;
  pPVar5 = google::protobuf::Arena::CreateMaybeMessage<Messages::Person_PhoneNumber>
                     ((person->phones_).super_RepeatedPtrFieldBase.arena_);
  pRVar3 = (person->phones_).super_RepeatedPtrFieldBase.rep_;
  iVar1 = (person->phones_).super_RepeatedPtrFieldBase.current_size_;
  (person->phones_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  pRVar3->elements[iVar1] = pPVar5;
LAB_001079a2:
  *(byte *)(pPVar5->_has_bits_).has_bits_ = (byte)(pPVar5->_has_bits_).has_bits_[0] | 1;
  pAVar6 = *(Arena **)&pPVar5->field_0x8;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  psVar2 = (pPVar5->number_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstance(&pPVar5->number_,pAVar6,&local_88);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  bVar4 = Messages::Person_PhoneType_IsValid(0);
  if (bVar4) {
    *(byte *)(pPVar5->_has_bits_).has_bits_ = (byte)(pPVar5->_has_bits_).has_bits_[0] | 2;
    pPVar5->type_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    return;
  }
  __assert_fail("::Messages::Person_PhoneType_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O1/proto/messages.pb.h"
                ,0x339,
                "void Messages::Person_PhoneNumber::_internal_set_type(::Messages::Person_PhoneType)"
               );
}

Assistant:

void generate_a_record(Messages::Person* person) {
  int id = 0;
  person->set_id(id);
  string name = "John Doe";
  person->set_name(name);
  string email = "JohnDoe@gmail.com";
  person->set_email(email);
  string number = "032-9898-8765";
  Messages::Person::PhoneNumber* phone_number = person->add_phones();
  phone_number->set_number(number);
  phone_number->set_type(Messages::Person::MOBILE);
}